

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectTfi_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,iObj);
    pObj_00 = Gia_ManObj(p,iObj);
    iVar1 = Gia_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDfs.c"
                      ,0x224,"void Gia_ManCollectTfi_rec(Gia_Man_t *, int, Vec_Int_t *)");
      }
      iVar1 = Gia_ObjFaninId0(pObj_00,iObj);
      Gia_ManCollectTfi_rec(p,iVar1,vNodes);
      iVar1 = Gia_ObjFaninId1(pObj_00,iObj);
      Gia_ManCollectTfi_rec(p,iVar1,vNodes);
      Vec_IntPush(vNodes,iObj);
    }
  }
  return;
}

Assistant:

void Gia_ManCollectTfi_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCollectTfi_rec( p, Gia_ObjFaninId0(pObj, iObj), vNodes );
    Gia_ManCollectTfi_rec( p, Gia_ObjFaninId1(pObj, iObj), vNodes );
    Vec_IntPush( vNodes, iObj );
}